

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean next_marker(j_decompress_ptr cinfo)

{
  char cVar1;
  jpeg_source_mgr *pjVar2;
  boolean bVar3;
  uint uVar4;
  JOCTET *pJVar5;
  size_t local_38;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int c;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  local_38 = pjVar2->bytes_in_buffer;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  while( true ) {
    if (local_38 == 0) {
      bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar3 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar2->next_input_byte;
      local_38 = pjVar2->bytes_in_buffer;
    }
    cVar1 = *(char *)bytes_in_buffer;
    while( true ) {
      bytes_in_buffer = bytes_in_buffer + 1;
      local_38 = local_38 - 1;
      if (cVar1 == -1) break;
      cinfo->marker->discarded_bytes = cinfo->marker->discarded_bytes + 1;
      pjVar2->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar2->bytes_in_buffer = local_38;
      if (local_38 == 0) {
        bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
        if (bVar3 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar2->next_input_byte;
        local_38 = pjVar2->bytes_in_buffer;
      }
      cVar1 = *(char *)bytes_in_buffer;
    }
    do {
      if (local_38 == 0) {
        bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
        if (bVar3 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar2->next_input_byte;
        local_38 = pjVar2->bytes_in_buffer;
      }
      local_38 = local_38 - 1;
      pJVar5 = (JOCTET *)(bytes_in_buffer + 1);
      uVar4 = (uint)*(byte *)bytes_in_buffer;
      bytes_in_buffer = (size_t)pJVar5;
    } while (uVar4 == 0xff);
    if (uVar4 != 0) break;
    cinfo->marker->discarded_bytes = cinfo->marker->discarded_bytes + 2;
    pjVar2->next_input_byte = pJVar5;
    pjVar2->bytes_in_buffer = local_38;
  }
  if (cinfo->marker->discarded_bytes != 0) {
    cinfo->err->msg_code = 0x77;
    (cinfo->err->msg_parm).i[0] = cinfo->marker->discarded_bytes;
    (cinfo->err->msg_parm).i[1] = uVar4;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    cinfo->marker->discarded_bytes = 0;
  }
  cinfo->unread_marker = uVar4;
  pjVar2->next_input_byte = pJVar5;
  pjVar2->bytes_in_buffer = local_38;
  return 1;
}

Assistant:

LOCAL(boolean)
next_marker (j_decompress_ptr cinfo)
{
  int c;
  INPUT_VARS(cinfo);

  for (;;) {
    INPUT_BYTE(cinfo, c, return FALSE);
    /* Skip any non-FF bytes.
     * This may look a bit inefficient, but it will not occur in a valid file.
     * We sync after each discarded byte so that a suspending data source
     * can discard the byte from its buffer.
     */
    while (c != 0xFF) {
      cinfo->marker->discarded_bytes++;
      INPUT_SYNC(cinfo);
      INPUT_BYTE(cinfo, c, return FALSE);
    }
    /* This loop swallows any duplicate FF bytes.  Extra FFs are legal as
     * pad bytes, so don't count them in discarded_bytes.  We assume there
     * will not be so many consecutive FF bytes as to overflow a suspending
     * data source's input buffer.
     */
    do {
      INPUT_BYTE(cinfo, c, return FALSE);
    } while (c == 0xFF);
    if (c != 0)
      break;			/* found a valid marker, exit loop */
    /* Reach here if we found a stuffed-zero data sequence (FF/00).
     * Discard it and loop back to try again.
     */
    cinfo->marker->discarded_bytes += 2;
    INPUT_SYNC(cinfo);
  }

  if (cinfo->marker->discarded_bytes != 0) {
    WARNMS2(cinfo, JWRN_EXTRANEOUS_DATA, cinfo->marker->discarded_bytes, c);
    cinfo->marker->discarded_bytes = 0;
  }

  cinfo->unread_marker = c;

  INPUT_SYNC(cinfo);
  return TRUE;
}